

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

ssize_t __thiscall Process::read(Process *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  undefined4 uVar2;
  uint __i;
  int iVar3;
  long lVar4;
  int *piVar5;
  ssize_t sVar6;
  int iVar7;
  undefined4 in_register_00000034;
  timeval tv;
  fd_set fdr;
  
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    fdr.fds_bits[lVar4] = 0;
  }
  uVar1 = *(uint *)__nbytes;
  iVar3 = 0;
  if (((uVar1 & 1) != 0) && (iVar7 = this->fdStdOutRead, iVar3 = 0, iVar7 != 0)) {
    fdr.fds_bits[iVar7 / 0x40] = fdr.fds_bits[iVar7 / 0x40] | 1L << ((byte)iVar7 & 0x3f);
    iVar3 = iVar7;
  }
  if (((((uVar1 & 2) == 0) || (iVar7 = this->fdStdErrRead, iVar7 == 0)) ||
      (fdr.fds_bits[iVar7 / 0x40] = fdr.fds_bits[iVar7 / 0x40] | 1L << ((byte)iVar7 & 0x3f),
      iVar7 <= iVar3)) && (iVar7 = iVar3, iVar3 == 0)) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    tv.tv_sec = 1000;
    tv.tv_usec = 0;
    do {
      do {
        iVar3 = select(iVar7 + 1,(fd_set *)&fdr,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
      } while (iVar3 == 0);
      if (iVar3 != -1) {
        if ((((*(uint *)__nbytes & 1) == 0) || (iVar3 = this->fdStdOutRead, iVar3 == 0)) ||
           (((ulong)fdr.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) == 0)) {
          if ((*(uint *)__nbytes & 2) == 0) {
            return -1;
          }
          iVar3 = this->fdStdErrRead;
          if (iVar3 == 0) {
            return -1;
          }
          if (((ulong)fdr.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) == 0) {
            return -1;
          }
          this = (Process *)&this->fdStdErrRead;
          uVar2 = 2;
        }
        else {
          uVar2 = 1;
        }
        *(undefined4 *)__nbytes = uVar2;
        sVar6 = ::read(this->fdStdOutRead,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf)
        ;
        return sVar6;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  }
  return -1;
}

Assistant:

ssize Process::read(void* buffer, usize length, uint& streams)
{
#ifdef _WIN32
  HANDLE handles[2];
  DWORD handleCount = 0;
  if(streams & stdoutStream && hStdOutRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdOutRead;
  if(streams & stderrStream && hStdErrRead != INVALID_HANDLE_VALUE)
    handles[handleCount++] = hStdErrRead;
  if(handleCount == 0)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return -1;
  }
  DWORD dw = WaitForMultipleObjects(handleCount, handles, FALSE, INFINITE);
  if(dw < WAIT_OBJECT_0 || dw >= WAIT_OBJECT_0 + handleCount)
    return -1;
  HANDLE readHandle = handles[dw - WAIT_OBJECT_0];
  streams = readHandle == hStdOutRead ? stdoutStream : stderrStream;
  DWORD i;
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  while(length > (usize)INT_MAX)
  {
    if(!ReadFile(readHandle, buffer, INT_MAX, &i, NULL))
    {
      if(GetLastError() == ERROR_BROKEN_PIPE)
        return (byte*)buffer - bufferStart;
      return -1;
    }
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    length -= INT_MAX;
  }
  if(!ReadFile(readHandle, buffer, (DWORD)length, &i, NULL))
  {
    if(GetLastError() == ERROR_BROKEN_PIPE)
      return (byte*)buffer - bufferStart;
    return -1;
  }
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  if(!ReadFile(readHandle, buffer, length, &i, NULL))
    return -1;
  return i;
#endif
#else
  fd_set fdr;
  FD_ZERO(&fdr);
  int maxFd = 0;
  if(streams & stdoutStream && fdStdOutRead)
  {
    FD_SET(fdStdOutRead, &fdr);
    maxFd = fdStdOutRead;
  }
  if(streams & stderrStream && fdStdErrRead)
  {
    FD_SET(fdStdErrRead, &fdr);
    if(fdStdErrRead > maxFd)
      maxFd = fdStdErrRead;
  }
  if(maxFd == 0)
  {
    errno = EINVAL;
    return -1;
  }
  timeval tv = {1000, 0};
  for(;;)
  {
    int i = select(maxFd + 1, &fdr, 0, 0, &tv);
    if(i == 0)
      continue;
    if(i == -1)
    {
      if (errno == EINTR)
        continue;
      return -1;
    }
    break;
  }
  if(streams & stdoutStream && fdStdOutRead && FD_ISSET(fdStdOutRead, &fdr))
  {
    streams = stdoutStream;
    return ::read(fdStdOutRead, buffer, length);
  }
  if(streams & stderrStream && fdStdErrRead && FD_ISSET(fdStdErrRead, &fdr))
  {
    streams = stderrStream;
    return ::read(fdStdErrRead, buffer, length);
  }
  return -1;
#endif
}